

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O2

bool __thiscall
HdmiCecAnalyzer::ReadBlockByte(HdmiCecAnalyzer *this,int blockIndex,Frame *byteFrame)

{
  Frame *pFVar1;
  bool bVar2;
  Frame FVar3;
  int iVar4;
  Frame *lastSample;
  Frame *firstSample;
  byte bVar5;
  bool value;
  Frame *local_40;
  int local_34;
  
  local_40 = byteFrame;
  local_34 = blockIndex;
  iVar4 = AnalyzerChannelData::GetBitState();
  if (iVar4 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  pFVar1 = local_40 + 8;
  bVar5 = 0;
  iVar4 = 7;
  while( true ) {
    if (iVar4 < 0) {
      *(ulong *)(local_40 + 0x10) = (ulong)bVar5;
      FVar3 = (Frame)0x1;
      if (local_34 != 0) {
        if (local_34 == 1) {
          FVar3 = (Frame)0x2;
        }
        else {
          FVar3 = (Frame)0x3;
          if (0xf < local_34) {
            return false;
          }
        }
      }
      local_40[0x20] = FVar3;
      return true;
    }
    firstSample = (Frame *)0x0;
    if (iVar4 == 7) {
      firstSample = local_40;
    }
    lastSample = (Frame *)0x0;
    if (iVar4 == 0) {
      lastSample = pFVar1;
    }
    bVar2 = ReadBit(this,&value,(S64 *)firstSample,(S64 *)lastSample);
    if (!bVar2) break;
    bVar5 = bVar5 | value << ((byte)iVar4 & 0x1f);
    iVar4 = iVar4 + -1;
  }
  return false;
}

Assistant:

bool HdmiCecAnalyzer::ReadBlockByte( int blockIndex, Frame& byteFrame )
{
    // The bus should be in LOW
    if( mCec->GetBitState() == BIT_HIGH )
        mCec->AdvanceToNextEdge();

    // Read block byte
    bool value;
    U8 byte = 0;

    for( int bit = 7; bit >= 0; bit-- )
    {
        S64* firstSample = ( bit == 7 ) ? &byteFrame.mStartingSampleInclusive : 0;
        S64* lastSample = ( bit == 0 ) ? &byteFrame.mEndingSampleInclusive : 0;
        if( !ReadBit( value, firstSample, lastSample ) )
            return false;
        byte |= value << bit;
    }
    byteFrame.mData1 = byte;

    // Depending on the position on the message set blockByte type
    if( !blockIndex )
        byteFrame.mType = HdmiCec::FrameType_Header;
    else if( blockIndex == 1 )
        byteFrame.mType = HdmiCec::FrameType_OpCode;
    else if( blockIndex < HdmiCec::MaxMessageBlocks )
        byteFrame.mType = HdmiCec::FrameType_Operand;
    else
        return false;

    return true;
}